

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.h
# Opt level: O0

bool __thiscall
google::protobuf::compiler::cpp::FileGenerator::IsDepWeak(FileGenerator *this,FileDescriptor *dep)

{
  size_type sVar1;
  LogMessage *other;
  LogFinisher local_6d [20];
  byte local_59;
  LogMessage local_58;
  FileDescriptor *local_20;
  FileDescriptor *dep_local;
  FileGenerator *this_local;
  
  local_20 = dep;
  dep_local = (FileDescriptor *)this;
  sVar1 = std::
          set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          ::count(&this->weak_deps_,&local_20);
  if (sVar1 == 0) {
    this_local._7_1_ = false;
  }
  else {
    local_59 = 0;
    if (((this->options_).opensource_runtime & 1U) != 0) {
      internal::LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_file.h"
                 ,0xb2);
      local_59 = 1;
      other = internal::LogMessage::operator<<
                        (&local_58,"CHECK failed: !options_.opensource_runtime: ");
      internal::LogFinisher::operator=(local_6d,other);
    }
    if ((local_59 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_58);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool IsDepWeak(const FileDescriptor* dep) const {
    if (weak_deps_.count(dep) != 0) {
      GOOGLE_CHECK(!options_.opensource_runtime);
      return true;
    }
    return false;
  }